

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_POINT10_v2::read
          (LASreadItemCompressed_POINT10_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  U32 UVar2;
  U32 UVar3;
  I32 IVar4;
  ArithmeticModel *pAVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  undefined8 *puVar7;
  uint local_a0;
  uint local_84;
  U8 local_6c;
  U8 local_68;
  U32 local_64;
  I32 val;
  I32 changed_values;
  I32 diff;
  I32 median;
  U32 k_bits;
  U32 l;
  U32 m;
  U32 n;
  U32 r;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_POINT10_v2 *this_local;
  
  puVar7 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar2 == 0) {
    uVar6 = (uint)(this->last_item[0xe] & 7);
    l = (U32)(this->last_item[0xe] >> 3 & 7);
    k_bits = (U32)number_return_map[l][uVar6];
    bVar1 = number_return_level[l][uVar6];
  }
  else {
    if ((UVar2 & 0x20) != 0) {
      if (this->m_bit_byte[this->last_item[0xe]] == (ArithmeticModel *)0x0) {
        pAVar5 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar5;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_bit_byte[this->last_item[0xe]],(U32 *)0x0);
      }
      UVar3 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_bit_byte[this->last_item[0xe]]);
      this->last_item[0xe] = (U8)UVar3;
    }
    uVar6 = (uint)(this->last_item[0xe] & 7);
    l = (U32)(this->last_item[0xe] >> 3 & 7);
    k_bits = (U32)number_return_map[l][uVar6];
    bVar1 = number_return_level[l][uVar6];
    if ((UVar2 & 0x10) == 0) {
      *(U16 *)(this->last_item + 0xc) = this->last_intensity[k_bits];
    }
    else {
      local_64 = k_bits;
      if (2 < k_bits) {
        local_64 = 3;
      }
      IVar4 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)this->last_intensity[k_bits],local_64);
      *(short *)(this->last_item + 0xc) = (short)IVar4;
      this->last_intensity[k_bits] = *(U16 *)(this->last_item + 0xc);
    }
    if ((UVar2 & 8) != 0) {
      if (this->m_classification[this->last_item[0xf]] == (ArithmeticModel *)0x0) {
        pAVar5 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar5;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_classification[this->last_item[0xf]],(U32 *)0x0);
      }
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec,this->m_classification[this->last_item[0xf]]);
      this->last_item[0xf] = (U8)UVar3;
    }
    if ((UVar2 & 4) != 0) {
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec,this->m_scan_angle_rank[this->last_item[0xe] >> 6 & 1]);
      if ((int)(UVar3 + this->last_item[0x10]) < 0) {
        local_68 = (char)UVar3 + this->last_item[0x10];
      }
      else {
        if ((int)(UVar3 + this->last_item[0x10]) < 0x100) {
          local_6c = this->last_item[0x10];
        }
        else {
          local_6c = this->last_item[0x10];
        }
        local_6c = (char)UVar3 + local_6c;
        local_68 = local_6c;
      }
      this->last_item[0x10] = local_68;
    }
    if ((UVar2 & 2) != 0) {
      if (this->m_user_data[this->last_item[0x11]] == (ArithmeticModel *)0x0) {
        pAVar5 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar5;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_user_data[this->last_item[0x11]],(U32 *)0x0);
      }
      UVar3 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_user_data[this->last_item[0x11]]);
      this->last_item[0x11] = (U8)UVar3;
    }
    if ((UVar2 & 1) != 0) {
      IVar4 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar4;
    }
  }
  median = (I32)bVar1;
  IVar4 = StreamingMedian5::get(this->last_x_diff_median5 + k_bits);
  IVar4 = IntegerCompressor::decompress(this->ic_dx,IVar4,(uint)(l == 1));
  *(I32 *)this->last_item = IVar4 + *(int *)this->last_item;
  StreamingMedian5::add(this->last_x_diff_median5 + k_bits,IVar4);
  IVar4 = StreamingMedian5::get(this->last_y_diff_median5 + k_bits);
  UVar2 = IntegerCompressor::getK(this->ic_dx);
  if (UVar2 < 0x14) {
    local_84 = UVar2 & 0xfffffffe;
  }
  else {
    local_84 = 0x14;
  }
  IVar4 = IntegerCompressor::decompress(this->ic_dy,IVar4,(l == 1) + local_84);
  *(I32 *)(this->last_item + 4) = IVar4 + *(int *)(this->last_item + 4);
  StreamingMedian5::add(this->last_y_diff_median5 + k_bits,IVar4);
  UVar2 = IntegerCompressor::getK(this->ic_dx);
  UVar3 = IntegerCompressor::getK(this->ic_dy);
  local_a0 = UVar2 + UVar3 >> 1;
  if (local_a0 < 0x12) {
    local_a0 = local_a0 & 0xfffffffe;
  }
  else {
    local_a0 = 0x12;
  }
  IVar4 = IntegerCompressor::decompress
                    (this->ic_z,this->last_height[(uint)median],(l == 1) + local_a0);
  *(I32 *)(this->last_item + 8) = IVar4;
  this->last_height[(uint)median] = *(I32 *)(this->last_item + 8);
  *puVar7 = *(undefined8 *)this->last_item;
  puVar7[1] = *(undefined8 *)(this->last_item + 8);
  *(undefined4 *)(puVar7 + 2) = *(undefined4 *)(this->last_item + 0x10);
  return (ssize_t)puVar7;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v2::read(U8* item, U32& context)
{
  U32 r, n, m, l;
  U32 k_bits;
  I32 median, diff;

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 32)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];

    // decompress the intensity if it has changed
    if (changed_values & 16)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(last_intensity[m], (m < 3 ? m : 3));
      last_intensity[m] = ((LASpoint10*)last_item)->intensity;
    }
    else
    {
      ((LASpoint10*)last_item)->intensity = last_intensity[m];
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      I32 val = dec->decodeSymbol(m_scan_angle_rank[((LASpoint10*)last_item)->scan_direction_flag]);
      last_item[16] = U8_FOLD(val + last_item[16]);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }
  else
  {
    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];
  }

  // decompress x coordinate
  median = last_x_diff_median5[m].get();
  diff = ic_dx->decompress(median, n==1);
  ((LASpoint10*)last_item)->x += diff;
  last_x_diff_median5[m].add(diff);

  // decompress y coordinate
  median = last_y_diff_median5[m].get();
  k_bits = ic_dx->getK();
  diff = ic_dy->decompress(median, (n==1) + ( k_bits < 20 ? U32_ZERO_BIT_0(k_bits) : 20 ));
  ((LASpoint10*)last_item)->y += diff;
  last_y_diff_median5[m].add(diff);

  // decompress z coordinate
  k_bits = (ic_dx->getK() + ic_dy->getK()) / 2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(last_height[l], (n==1) + (k_bits < 18 ? U32_ZERO_BIT_0(k_bits) : 18));
  last_height[l] = ((LASpoint10*)last_item)->z;

  // copy the last point
  memcpy(item, last_item, 20);
}